

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O0

pool_ptr<soul::heart::Variable> __thiscall
soul::Module::StateVariables::find(StateVariables *this,string_view name)

{
  string_view other;
  bool bVar1;
  pool_ref<soul::heart::Variable> *ppVar2;
  Variable *pVVar3;
  char *in_RCX;
  pool_ref<soul::heart::Variable> *v;
  pool_ref<soul::heart::Variable> *__end1;
  pool_ref<soul::heart::Variable> *__begin1;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_32UL> *__range1;
  StateVariables *this_local;
  string_view name_local;
  
  __end1 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_32UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_32UL> *)
                      name._M_len);
  ppVar2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_32UL>::end
                     ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_32UL> *)
                      name._M_len);
  while( true ) {
    if (__end1 == ppVar2) {
      pool_ptr<soul::heart::Variable>::pool_ptr((pool_ptr<soul::heart::Variable> *)this);
      return (pool_ptr<soul::heart::Variable>)(Variable *)this;
    }
    pVVar3 = pool_ref<soul::heart::Variable>::operator->(__end1);
    other._M_str = in_RCX;
    other._M_len = (size_t)name._M_str;
    bVar1 = Identifier::operator==(&pVVar3->name,other);
    if (bVar1) break;
    __end1 = __end1 + 1;
  }
  pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
  return (pool_ptr<soul::heart::Variable>)(Variable *)this;
}

Assistant:

pool_ptr<heart::Variable> Module::StateVariables::find (std::string_view name) const
{
    for (auto& v : stateVariables)
        if (v->name == name)
            return v;

    return {};
}